

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O2

void __thiscall CBroadcast::CBroadcast(CBroadcast *this)

{
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CBroadcast_00206a68;
  CTextCursor::CTextCursor(&this->m_ClientBroadcastCursor);
  CTextCursor::CTextCursor(&this->m_ServerBroadcastCursor);
  (*(this->super_CComponent)._vptr_CComponent[7])(this);
  return;
}

Assistant:

CBroadcast::CBroadcast()
{
	OnReset();
}